

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O1

void __thiscall DecHeap::trickle_down(DecHeap *this,size_t idx)

{
  ulong uVar1;
  pointer ppVar2;
  pointer puVar3;
  unsigned_long uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long __tmp;
  pointer ppVar8;
  pointer ppVar9;
  
  ppVar2 = (this->heap).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(this->heap).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 4;
  puVar3 = (this->idx_map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  while( true ) {
    uVar1 = idx * 2 + 1;
    if (uVar5 <= uVar1) {
      return;
    }
    uVar7 = idx * 2 + 2;
    uVar6 = uVar1;
    if ((uVar7 < uVar5) && (uVar6 = uVar7, ppVar2[uVar1].first <= ppVar2[uVar7].first)) {
      uVar6 = uVar1;
    }
    uVar1 = ppVar2[idx].first;
    if (uVar1 <= ppVar2[uVar6].first) break;
    ppVar8 = ppVar2 + uVar6;
    ppVar9 = ppVar2 + idx;
    ppVar9->first = ppVar2[uVar6].first;
    ppVar8->first = uVar1;
    uVar4 = ppVar9->second;
    ppVar9->second = ppVar8->second;
    ppVar8->second = uVar4;
    puVar3[ppVar9->second] = idx;
    puVar3[ppVar8->second] = uVar6;
    idx = uVar6;
  }
  return;
}

Assistant:

void DecHeap::trickle_down(size_t idx) {
    while ((idx * 2 + 1) < heap.size()) {
        auto min_idx = idx * 2 + 1;
        if ((idx * 2 + 2) < heap.size() && heap[idx * 2 + 2].first < heap[idx * 2 + 1].first) {
            min_idx += 1;
        }
        if (heap[min_idx].first < heap[idx].first) {
            this->swap(idx, min_idx);
            idx = min_idx;
        } else {
            break;
        }
    }
}